

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

sb_decision_t sb_check_block_reusing(fdb_kvs_handle *handle)

{
  long lVar1;
  file_status_t fVar2;
  bool bVar3;
  __atomic_base<unsigned_long> *this;
  uint64_t uVar4;
  atomic<unsigned_long> *atomic_val;
  uint64_t uVar5;
  size_t sVar6;
  __int_type _Var7;
  long in_RDI;
  uint64_t block_reusing_threshold;
  superblock *sb;
  uint64_t ratio;
  uint64_t filesize;
  uint64_t live_datasize;
  undefined8 in_stack_ffffffffffffffb8;
  memory_order order;
  superblock *sb_00;
  atomic<unsigned_long> *in_stack_ffffffffffffffc0;
  fdb_file_handle *in_stack_ffffffffffffffd8;
  sb_decision_t local_4;
  
  order = (memory_order)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  lVar1 = *(long *)(*(long *)(in_RDI + 0x48) + 0x198);
  if (lVar1 == 0) {
    local_4 = SBD_NONE;
  }
  else {
    fVar2 = filemgr_get_file_status((filemgr *)0x186901);
    if (fVar2 == '\0') {
      this = (__atomic_base<unsigned_long> *)atomic_get_uint64_t(in_stack_ffffffffffffffc0,order);
      if ((this == (__atomic_base<unsigned_long> *)0x0) ||
         ((__atomic_base<unsigned_long> *)0x63 < this)) {
        local_4 = SBD_NONE;
      }
      else {
        uVar4 = filemgr_get_pos((filemgr *)0x186961);
        if (uVar4 < *(ulong *)(in_RDI + 0x130)) {
          local_4 = SBD_NONE;
        }
        else {
          atomic_val = (atomic<unsigned_long> *)
                       std::__atomic_base::operator_cast_to_unsigned_long(this);
          sb_00 = *(superblock **)(lVar1 + 0xa0);
          uVar5 = atomic_get_uint64_t(atomic_val,(memory_order)((ulong)sb_00 >> 0x20));
          if ((atomic<unsigned_long> *)((long)&sb_00->config + uVar5) < atomic_val) {
            sVar6 = fdb_estimate_space_used(in_stack_ffffffffffffffd8);
            if (((uVar4 == 0) || (sVar6 == 0)) || (uVar4 < sVar6)) {
              local_4 = SBD_NONE;
            }
            else if (this < (__atomic_base<unsigned_long> *)(((uVar4 - sVar6) * 100) / uVar4)) {
              bVar3 = sb_bmp_exists(sb_00);
              if (bVar3) {
                if ((*(long *)(in_RDI + 0x138) == 0) ||
                   (_Var7 = std::__atomic_base::operator_cast_to_unsigned_long(this),
                   _Var7 < *(ulong *)(in_RDI + 0x138))) {
                  if (*(long *)(lVar1 + 0x80) == 0) {
                    if (*(long *)(lVar1 + 0x88) == 0) {
                      local_4 = SBD_RECLAIM;
                    }
                    else {
                      local_4 = SBD_SWITCH;
                    }
                  }
                  else if ((((*(byte *)(in_RDI + 0x159) & 1) == 0) ||
                           ((ulong)(*(long *)(lVar1 + 0x78) * 10) <=
                            (ulong)(*(long *)(lVar1 + 0x80) * 100))) ||
                          ((ulong)(*(long *)(lVar1 + 0x78) *
                                  (long)**(int **)(*(long *)(in_RDI + 0x48) + 0x110)) < 0x1000001))
                  {
                    local_4 = SBD_NONE;
                  }
                  else {
                    local_4 = SBD_RESERVE;
                  }
                }
                else {
                  local_4 = SBD_NONE;
                }
              }
              else {
                local_4 = SBD_RECLAIM;
              }
            }
            else {
              local_4 = SBD_NONE;
            }
          }
          else {
            local_4 = SBD_NONE;
          }
        }
      }
    }
    else {
      local_4 = SBD_NONE;
    }
  }
  return local_4;
}

Assistant:

sb_decision_t sb_check_block_reusing(fdb_kvs_handle *handle)

{
    // start block reusing when
    // 1) if blocks are not reused yet in this file:
    //    when file size becomes larger than the threshold
    // 2) otherwise:
    //    when # free blocks decreases under the threshold

    uint64_t live_datasize;
    uint64_t filesize;
    uint64_t ratio;
    struct superblock *sb = handle->file->sb;

    if (!sb) {
        return SBD_NONE;
    }

    if (filemgr_get_file_status(handle->file) != FILE_NORMAL) {
        // being compacted file does not allow block reusing
        return SBD_NONE;
    }

    uint64_t block_reusing_threshold =
        atomic_get_uint64_t(&handle->file->config->block_reusing_threshold,
                            std::memory_order_relaxed);
    if (block_reusing_threshold == 0 || block_reusing_threshold >= 100) {
        // circular block reusing is disabled
        return SBD_NONE;
    }

    filesize = filemgr_get_pos(handle->file);
    if (filesize < handle->config.min_block_reuse_filesize) {
        return SBD_NONE;
    }

    // at least # keeping headers should exist
    // since the last block reusing
    if (handle->cur_header_revnum <=
        sb->min_live_hdr_revnum +
        atomic_get_uint64_t(&handle->file->config->num_keeping_headers,
                            std::memory_order_relaxed)) {
        return SBD_NONE;
    }

    live_datasize = fdb_estimate_space_used(handle->fhandle);
    if (filesize == 0 || live_datasize == 0 ||
        live_datasize > filesize) {
        return SBD_NONE;
    }

    ratio = (filesize - live_datasize) * 100 / filesize;

    if (ratio <= block_reusing_threshold) return SBD_NONE;

    if (!sb_bmp_exists(sb)) {
        // block reusing has not been started yet
        return SBD_RECLAIM;
    } else if ( handle->config.max_block_reusing_cycle &&
                sb->bmp_revnum >= handle->config.max_block_reusing_cycle ) {
        // Cannot exceed the max cycle.
        return SBD_NONE;
    }

    // stale blocks are already being reused before
    if (sb->num_free_blocks == 0) {
        if (sb->rsv_bmp) {
            // reserved bitmap exists
            return SBD_SWITCH;
        } else {
            // re-reclaim
            return SBD_RECLAIM;
        }
    } else if ( handle->config.enable_reusable_block_reservation &&
                ( sb->num_free_blocks * 100 <
                      sb->num_init_free_blocks * SB_PRE_RECLAIM_RATIO ) ) {
        if (sb->num_init_free_blocks * handle->file->config->blocksize >
            SB_MIN_BLOCK_REUSING_FILESIZE)  {
            return SBD_RESERVE;
        }
    }

    return SBD_NONE;
}